

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_router_interface.c
# Opt level: O0

void dlep_router_interface_cleanup(void)

{
  list_entity *plVar1;
  list_entity *plVar2;
  avl_tree *paVar3;
  list_entity *__tempptr_3;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  dlep_router_if *it;
  dlep_router_if *interf;
  
  paVar3 = dlep_if_get_tree(false);
  plVar1 = (paVar3->list_head).next;
  it = (dlep_router_if *)(plVar1 + -0xb5);
  plVar1 = plVar1->next;
  while( true ) {
    __tempptr = plVar1 + -0xb5;
    plVar2 = (it->interf)._node.list.prev;
    paVar3 = dlep_if_get_tree(false);
    if (plVar2 == (paVar3->list_head).prev) break;
    dlep_router_remove_interface(it);
    it = (dlep_router_if *)__tempptr;
    plVar1 = plVar1->next;
  }
  oonf_class_remove(&_router_if_class);
  dlep_base_ip_cleanup();
  dlep_router_session_cleanup();
  dlep_extension_cleanup();
  oonf_layer2_origin_remove(&_l2_origin);
  oonf_timer_remove(&_connect_to_watchdog_class);
  return;
}

Assistant:

void
dlep_router_interface_cleanup(void) {
  struct dlep_router_if *interf, *it;

  avl_for_each_element_safe(dlep_if_get_tree(false), interf, interf._node, it) {
    dlep_router_remove_interface(interf);
  }

  oonf_class_remove(&_router_if_class);

  dlep_base_ip_cleanup();
  dlep_router_session_cleanup();
  dlep_extension_cleanup();
  oonf_layer2_origin_remove(&_l2_origin);
  oonf_timer_remove(&_connect_to_watchdog_class);
}